

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCover.c
# Opt level: O3

Mvc_Cover_t * Mvc_CoverDup(Mvc_Cover_t *p)

{
  int *piVar1;
  int iVar2;
  Mvc_Cover_t *pMVar3;
  Mvc_Cube_t *pMVar4;
  Mvc_Cube_t *pMVar5;
  Mvc_List_t *pList;
  Mvc_Cube_t *pCube;
  
  pMVar3 = (Mvc_Cover_t *)Extra_MmFixedEntryFetch(p->pMem->pManC);
  pMVar3->pMem = p->pMem;
  pMVar3->nBits = p->nBits;
  iVar2 = p->nUnused;
  pMVar3->nWords = p->nWords;
  pMVar3->nUnused = iVar2;
  pMVar3->nCubesAlloc = 0;
  pMVar3->pCubes = (Mvc_Cube_t **)0x0;
  (pMVar3->lCubes).nItems = 0;
  (pMVar3->lCubes).pHead = (Mvc_Cube_t *)0x0;
  (pMVar3->lCubes).pTail = (Mvc_Cube_t *)0x0;
  pMVar3->pLits = (int *)0x0;
  pMVar3->pMask = (Mvc_Cube_t *)0x0;
  pCube = (p->lCubes).pHead;
  if (pCube != (Mvc_Cube_t *)0x0) {
    do {
      pMVar4 = Mvc_CubeDup(p,pCube);
      pMVar5 = (Mvc_Cube_t *)&pMVar3->lCubes;
      if ((pMVar3->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar5 = (pMVar3->lCubes).pTail;
      }
      pMVar5->pNext = pMVar4;
      (pMVar3->lCubes).pTail = pMVar4;
      pMVar4->pNext = (Mvc_Cube_t *)0x0;
      piVar1 = &(pMVar3->lCubes).nItems;
      *piVar1 = *piVar1 + 1;
      pCube = pCube->pNext;
    } while (pCube != (Mvc_Cube_t *)0x0);
  }
  return pMVar3;
}

Assistant:

Mvc_Cover_t * Mvc_CoverDup( Mvc_Cover_t * p )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    // clone the cover
    pCover = Mvc_CoverClone( p );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
    {
        pCubeCopy = Mvc_CubeDup( p, pCube );
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );
    }
    return pCover;
}